

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O1

int CVApolynomialStorePnt(CVodeMem cv_mem,CVdtpntMem d)

{
  CVadjMemRec *pCVar1;
  undefined8 *puVar2;
  sunrealtype *psVar3;
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  long lVar10;
  
  pCVar1 = cv_mem->cv_adj_mem;
  puVar2 = (undefined8 *)d->content;
  N_VScale(0x3ff0000000000000,cv_mem->cv_zn[0],*puVar2);
  auVar4 = _DAT_00138040;
  if (pCVar1->ca_IMstoreSensi != 0) {
    iVar5 = cv_mem->cv_Ns;
    lVar7 = (long)iVar5;
    if (0 < lVar7) {
      psVar3 = cv_mem->cv_cvals;
      lVar6 = lVar7 + -1;
      auVar8._8_4_ = (int)lVar6;
      auVar8._0_8_ = lVar6;
      auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
      lVar6 = 0;
      auVar8 = auVar8 ^ _DAT_00138040;
      auVar9 = _DAT_00138030;
      do {
        auVar11 = auVar9 ^ auVar4;
        if ((bool)(~(auVar11._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar11._0_4_ ||
                    auVar8._4_4_ < auVar11._4_4_) & 1)) {
          *(undefined8 *)((long)psVar3 + lVar6) = 0x3ff0000000000000;
        }
        if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
            auVar11._12_4_ <= auVar8._12_4_) {
          *(undefined8 *)((long)psVar3 + lVar6 + 8) = 0x3ff0000000000000;
        }
        lVar10 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar10 + 2;
        lVar6 = lVar6 + 0x10;
      } while ((ulong)(iVar5 + 1U >> 1) << 4 != lVar6);
    }
    iVar5 = N_VScaleVectorArray(lVar7,cv_mem->cv_cvals,cv_mem->cv_znS[0],puVar2[1]);
    if (iVar5 != 0) {
      return -0x1c;
    }
  }
  *(int *)(puVar2 + 2) = cv_mem->cv_qu;
  return 0;
}

Assistant:

static int CVApolynomialStorePnt(CVodeMem cv_mem, CVdtpntMem d)
{
  CVadjMem ca_mem;
  CVpolynomialDataMem content;
  int is, retval;

  ca_mem = cv_mem->cv_adj_mem;

  content = (CVpolynomialDataMem)d->content;

  N_VScale(ONE, cv_mem->cv_zn[0], content->y);

  if (ca_mem->ca_IMstoreSensi)
  {
    for (is = 0; is < cv_mem->cv_Ns; is++) { cv_mem->cv_cvals[is] = ONE; }
    retval = N_VScaleVectorArray(cv_mem->cv_Ns, cv_mem->cv_cvals,
                                 cv_mem->cv_znS[0], content->yS);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
  }

  content->order = cv_mem->cv_qu;

  return (0);
}